

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderedTestTest.cpp
# Opt level: O0

void __thiscall
TEST_TestOrderedTest_TwoTestsAddedInReverseOrder_Test::testBody
          (TEST_TestOrderedTest_TwoTestsAddedInReverseOrder_Test *this)

{
  UtestShell *pUVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  TEST_TestOrderedTest_TwoTestsAddedInReverseOrder_Test *this_local;
  
  TEST_GROUP_CppUTestGroupTestOrderedTest::InstallOrderedTest
            (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest,
             &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest,5);
  TEST_GROUP_CppUTestGroupTestOrderedTest::InstallOrderedTest
            (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest,
             &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest2,3);
  pUVar1 = UtestShell::getCurrent();
  pUVar2 = TEST_GROUP_CppUTestGroupTestOrderedTest::firstTest
                     (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)((OrderedTestShell *)pUVar2 ==
                           &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest2),
             "CHECK","firstTest() == &orderedTest2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x6f,pTVar3);
  pUVar1 = UtestShell::getCurrent();
  pUVar2 = TEST_GROUP_CppUTestGroupTestOrderedTest::secondTest
                     (&this->super_TEST_GROUP_CppUTestGroupTestOrderedTest);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar1->_vptr_UtestShell[8])
            (pUVar1,(ulong)((OrderedTestShell *)pUVar2 ==
                           &(this->super_TEST_GROUP_CppUTestGroupTestOrderedTest).orderedTest),
             "CHECK","secondTest() == &orderedTest",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/OrderedTestTest.cpp"
             ,0x70,pTVar3);
  return;
}

Assistant:

TEST(TestOrderedTest, TwoTestsAddedInReverseOrder)
{
    InstallOrderedTest(orderedTest, 5);
    InstallOrderedTest(orderedTest2, 3);
    CHECK(firstTest() == &orderedTest2);
    CHECK(secondTest() == &orderedTest);
}